

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_permute_axes<unsigned_int>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,char *axes_order,
          uint *param_2)

{
  uint *puVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [12];
  unkbyte10 Var9;
  bool bVar10;
  byte bVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  CImgArgumentException *this_00;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar20;
  int y;
  long lVar21;
  int y_15;
  long lVar22;
  long lVar23;
  char *pcVar24;
  char cVar25;
  char cVar37;
  char cVar38;
  char cVar39;
  undefined1 auVar28 [16];
  undefined1 auVar33 [16];
  CImg<unsigned_int> res;
  uchar s_code [4];
  uchar n_code [4];
  CImg<unsigned_int> *pCVar19;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar26 [12];
  undefined1 auVar29 [16];
  undefined1 auVar27 [13];
  undefined1 auVar30 [16];
  undefined1 auVar36 [16];
  undefined1 auVar32 [16];
  undefined1 auVar31 [16];
  undefined2 uVar40;
  
  pCVar19 = this;
  bVar10 = is_empty(this);
  if (axes_order == (char *)0x0 || bVar10) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  res._data = (uint *)0x0;
  res._width = 0;
  res._height = 0;
  res._depth = 0;
  res._spectrum = 0;
  res._is_shared = false;
  puVar13 = this->_data;
  n_code[0] = '\0';
  n_code[1] = '\0';
  n_code[2] = '\0';
  n_code[3] = '\0';
  s_code[0] = '\0';
  s_code[1] = '\x01';
  s_code[2] = '\x02';
  s_code[3] = '\x03';
  lVar12 = 0;
  while( true ) {
    uVar16 = (uint)pCVar19;
    bVar11 = axes_order[lVar12];
    if (bVar11 == 0) break;
    uVar16 = (uint)bVar11;
    uVar15 = bVar11 + 0x20 & 0xff;
    if ((byte)(bVar11 + 0xa5) < 0xe6) {
      uVar15 = (uint)bVar11;
    }
    if (lVar12 == 4) {
LAB_0019d7cd:
      s_code[0] = '\x04';
      bVar11 = 4;
      goto LAB_0019d7da;
    }
    uVar16 = uVar15 - 99;
    pCVar19 = (CImg<unsigned_int> *)(ulong)uVar16;
    if ((0x17 < uVar16) || ((0xe00001U >> (uVar16 & 0x1f) & 1) == 0)) goto LAB_0019d7cd;
    n_code[uVar15 & 3] = n_code[uVar15 & 3] + '\x01';
    s_code[lVar12] = (uchar)(uVar15 & 3);
    lVar12 = lVar12 + 1;
  }
  bVar11 = s_code[0];
LAB_0019d7da:
  bVar3 = n_code[0];
  bVar4 = n_code[1];
  bVar5 = n_code[2];
  bVar6 = n_code[3];
  cVar25 = -((byte)((bVar3 == 0) * bVar3 | bVar3 != 0) == bVar3);
  cVar37 = -((byte)((bVar4 == 0) * bVar4 | bVar4 != 0) == bVar4);
  cVar38 = -((byte)((bVar5 == 0) * bVar5 | bVar5 != 0) == bVar5);
  cVar39 = -((byte)((bVar6 == 0) * bVar6 | bVar6 != 0) == bVar6);
  auVar26._0_11_ = ZEXT411(0xffffffff) << 0x38;
  auVar26[0xb] = 0xff;
  auVar27[0xc] = 0xff;
  auVar27._0_12_ = auVar26;
  auVar32[0xd] = 0xff;
  auVar32._0_13_ = auVar27;
  auVar32[0xe] = 0xff;
  auVar32[0xf] = 0xff;
  auVar31._14_2_ = auVar32._14_2_;
  auVar31[0xd] = 0xff;
  auVar31._0_13_ = auVar27;
  auVar30._13_3_ = auVar31._13_3_;
  auVar30[0xc] = 0xff;
  auVar30._0_12_ = auVar26;
  auVar29._12_4_ = auVar30._12_4_;
  auVar29[0xb] = 0xff;
  auVar29._0_11_ = auVar26._0_11_;
  Var9 = CONCAT91(CONCAT81((long)(CONCAT72((int7)(CONCAT63((int6)(CONCAT54(auVar29._11_5_,0xffffffff
                                                                          ) >> 0x18),0xffffff) >>
                                                 0x10),0xffff) >> 8),cVar39),cVar39);
  auVar8._2_10_ = Var9;
  auVar8[1] = cVar38;
  auVar8[0] = cVar38;
  auVar7._2_12_ = auVar8;
  auVar7[1] = cVar37;
  auVar7[0] = cVar37;
  auVar28._0_2_ = CONCAT11(cVar25,cVar25);
  auVar28._2_14_ = auVar7;
  uVar40 = (undefined2)Var9;
  auVar36._0_12_ = auVar28._0_12_;
  auVar36._12_2_ = uVar40;
  auVar36._14_2_ = uVar40;
  auVar35._12_4_ = auVar36._12_4_;
  auVar35._0_10_ = auVar28._0_10_;
  auVar35._10_2_ = auVar8._0_2_;
  auVar34._10_6_ = auVar35._10_6_;
  auVar34._0_8_ = auVar28._0_8_;
  auVar34._8_2_ = auVar8._0_2_;
  auVar33._8_8_ = auVar34._8_8_;
  auVar33._6_2_ = auVar7._0_2_;
  auVar33._4_2_ = auVar7._0_2_;
  auVar33._2_2_ = auVar28._0_2_;
  auVar33._0_2_ = auVar28._0_2_;
  iVar17 = movmskps(uVar16,auVar33);
  if ((bVar11 < 4 && *axes_order != '\0') && iVar17 == 0xf) {
    uVar16 = (uint)s_code >> 0x18 |
             ((uint)s_code >> 0x10 & 0xff) << 4 | ((uint)s_code >> 8 & 0xff) << 8 |
             (uint)bVar11 << 0xc;
    if (uVar16 == 0x3210) {
      assign(&res,this->_spectrum,this->_depth,this->_height,this->_width);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        for (iVar18 = 0; iVar18 < (int)this->_depth; iVar18 = iVar18 + 1) {
          lVar20 = 0;
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar18 + iVar17) * 4) = uVar16;
              lVar22 = lVar22 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
            }
            lVar20 = lVar20 + lVar12 * 4;
          }
        }
      }
    }
    else if (uVar16 == 0x132) {
      assign(&res,this->_width,this->_height,this->_spectrum,this->_depth);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
        for (lVar21 = 0; lVar21 < (int)this->_depth; lVar21 = lVar21 + 1) {
          for (iVar17 = 0; iVar17 < (int)this->_height; iVar17 = iVar17 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              res._data[lVar12 * lVar20 +
                        (res._8_8_ & 0xffffffff) * lVar12 * lVar21 +
                        (ulong)(res._width * iVar17 + iVar18)] = uVar16;
            }
          }
        }
      }
    }
    else if (uVar16 == 0x213) {
      assign(&res,this->_width,this->_depth,this->_height,this->_spectrum);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
        for (iVar17 = 0; iVar17 < (int)this->_depth; iVar17 = iVar17 + 1) {
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              res._data[lVar12 * lVar21 +
                        (res._8_8_ & 0xffffffff) * lVar12 * lVar20 +
                        (ulong)(res._width * iVar17 + iVar18)] = uVar16;
            }
          }
        }
      }
    }
    else if (uVar16 == 0x231) {
      assign(&res,this->_width,this->_depth,this->_spectrum,this->_height);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
        for (iVar17 = 0; iVar17 < (int)this->_depth; iVar17 = iVar17 + 1) {
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              res._data[lVar12 * lVar20 +
                        (res._8_8_ & 0xffffffff) * lVar12 * lVar21 +
                        (ulong)(res._width * iVar17 + iVar18)] = uVar16;
            }
          }
        }
      }
    }
    else if (uVar16 == 0x312) {
      assign(&res,this->_width,this->_spectrum,this->_height,this->_depth);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        for (lVar20 = 0; lVar20 < (int)this->_depth; lVar20 = lVar20 + 1) {
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              res._data[lVar12 * lVar21 +
                        (res._8_8_ & 0xffffffff) * lVar12 * lVar20 +
                        (ulong)(res._width * iVar17 + iVar18)] = uVar16;
            }
          }
        }
      }
    }
    else if (uVar16 == 0x321) {
      assign(&res,this->_width,this->_spectrum,this->_depth,this->_height);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        for (lVar20 = 0; lVar20 < (int)this->_depth; lVar20 = lVar20 + 1) {
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              res._data[lVar12 * lVar20 +
                        (res._8_8_ & 0xffffffff) * lVar12 * lVar21 +
                        (ulong)(res._width * iVar17 + iVar18)] = uVar16;
            }
          }
        }
      }
    }
    else if (uVar16 == 0x1023) {
      assign(&res,this->_height,this->_width,this->_depth,this->_spectrum);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
        for (lVar21 = 0; lVar21 < (int)this->_depth; lVar21 = lVar21 + 1) {
          for (iVar17 = 0; iVar17 < (int)this->_height; iVar17 = iVar17 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              res._data[lVar12 * lVar21 +
                        (res._8_8_ & 0xffffffff) * lVar12 * lVar20 +
                        (ulong)(res._width * iVar18 + iVar17)] = uVar16;
            }
          }
        }
      }
    }
    else if (uVar16 == 0x1032) {
      assign(&res,this->_height,this->_width,this->_spectrum,this->_depth);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
        for (lVar21 = 0; lVar21 < (int)this->_depth; lVar21 = lVar21 + 1) {
          for (iVar17 = 0; iVar17 < (int)this->_height; iVar17 = iVar17 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              res._data[lVar12 * lVar20 +
                        (res._8_8_ & 0xffffffff) * lVar12 * lVar21 +
                        (ulong)(res._width * iVar18 + iVar17)] = uVar16;
            }
          }
        }
      }
    }
    else if (uVar16 == 0x1203) {
      assign(&res,this->_height,this->_depth,this->_width,this->_spectrum);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar20 = 0;
      for (lVar21 = 0; lVar21 < (int)this->_spectrum; lVar21 = lVar21 + 1) {
        for (iVar17 = 0; iVar17 < (int)this->_depth; iVar17 = iVar17 + 1) {
          for (iVar18 = 0; iVar18 < (int)this->_height; iVar18 = iVar18 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar17 + iVar18) * 4) = uVar16;
              lVar22 = lVar22 + lVar12 * 4;
            }
          }
        }
        lVar20 = lVar20 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
      }
    }
    else if (uVar16 == 0x1230) {
      assign(&res,this->_height,this->_depth,this->_spectrum,this->_width);
      uVar16 = this->_width;
      switch(uVar16) {
      case 1:
        uVar16 = this->_depth;
        uVar15 = this->_height;
        uVar2 = this->_spectrum;
        for (lVar12 = 0; uVar16 * uVar15 * uVar2 != (int)lVar12; lVar12 = lVar12 + 1) {
          res._data[lVar12] = puVar13[lVar12];
        }
        break;
      case 2:
        uVar16 = this->_depth;
        uVar15 = this->_height;
        uVar2 = this->_spectrum;
        for (lVar12 = 0; uVar16 * uVar15 * uVar2 != (int)lVar12; lVar12 = lVar12 + 1) {
          res._data[lVar12] = puVar13[lVar12 * 2];
          res._data[(res._8_8_ & 0xffffffff) * (ulong)res._height * (res._0_8_ & 0xffffffff) +
                    lVar12] = puVar13[lVar12 * 2 + 1];
        }
        break;
      case 3:
        iVar17 = this->_depth * this->_height * this->_spectrum;
        lVar12 = (res._8_8_ & 0xffffffff) * (ulong)res._height * (res._0_8_ & 0xffffffff);
        puVar14 = res._data;
        while (bVar10 = iVar17 != 0, iVar17 = iVar17 + -1, bVar10) {
          *puVar14 = *puVar13;
          puVar14[lVar12] = puVar13[1];
          puVar14[lVar12 * 2] = puVar13[2];
          puVar14 = puVar14 + 1;
          puVar13 = puVar13 + 3;
        }
        break;
      case 4:
        lVar12 = (res._8_8_ & 0xffffffff) * (ulong)res._height * (res._0_8_ & 0xffffffff);
        iVar17 = this->_depth * this->_height * this->_spectrum;
        puVar14 = res._data;
        while (bVar10 = iVar17 != 0, iVar17 = iVar17 + -1, bVar10) {
          *puVar14 = *puVar13;
          puVar14[lVar12] = puVar13[1];
          puVar14[lVar12 * 2] = puVar13[2];
          puVar14[lVar12 * 3] = puVar13[3];
          puVar14 = puVar14 + 1;
          puVar13 = puVar13 + 4;
        }
        break;
      default:
        lVar12 = (ulong)res._height * (res._0_8_ & 0xffffffff);
        lVar20 = 0;
        for (lVar21 = 0; lVar21 < (int)this->_spectrum; lVar21 = lVar21 + 1) {
          for (iVar17 = 0; iVar17 < (int)this->_depth; iVar17 = iVar17 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_height; iVar18 = iVar18 + 1) {
              lVar22 = (long)res._data + lVar20;
              for (lVar23 = 0; lVar23 < (int)uVar16; lVar23 = lVar23 + 1) {
                uVar16 = *puVar13;
                puVar13 = puVar13 + 1;
                *(uint *)(lVar22 + (ulong)(res._width * iVar17 + iVar18) * 4) = uVar16;
                uVar16 = this->_width;
                lVar22 = lVar22 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
              }
            }
          }
          lVar20 = lVar20 + lVar12 * 4;
        }
        CImg(__return_storage_ptr__,&res);
        goto LAB_0019e8b3;
      }
    }
    else if (uVar16 == 0x1302) {
      assign(&res,this->_height,this->_spectrum,this->_width,this->_depth);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        lVar20 = 0;
        for (lVar21 = 0; lVar21 < (int)this->_depth; lVar21 = lVar21 + 1) {
          for (iVar18 = 0; iVar18 < (int)this->_height; iVar18 = iVar18 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar17 + iVar18) * 4) = uVar16;
              lVar22 = lVar22 + lVar12 * 4;
            }
          }
          lVar20 = lVar20 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
        }
      }
    }
    else if (uVar16 == 0x1320) {
      assign(&res,this->_height,this->_spectrum,this->_depth,this->_width);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        lVar20 = 0;
        for (lVar21 = 0; lVar21 < (int)this->_depth; lVar21 = lVar21 + 1) {
          for (iVar18 = 0; iVar18 < (int)this->_height; iVar18 = iVar18 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar17 + iVar18) * 4) = uVar16;
              lVar22 = lVar22 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
            }
          }
          lVar20 = lVar20 + lVar12 * 4;
        }
      }
    }
    else if (uVar16 == 0x2013) {
      assign(&res,this->_depth,this->_width,this->_height,this->_spectrum);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
        for (iVar17 = 0; iVar17 < (int)this->_depth; iVar17 = iVar17 + 1) {
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              res._data[lVar12 * lVar21 +
                        (res._8_8_ & 0xffffffff) * lVar12 * lVar20 +
                        (ulong)(res._width * iVar18 + iVar17)] = uVar16;
            }
          }
        }
      }
    }
    else if (uVar16 == 0x2031) {
      assign(&res,this->_depth,this->_width,this->_spectrum,this->_height);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
        for (iVar17 = 0; iVar17 < (int)this->_depth; iVar17 = iVar17 + 1) {
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              res._data[lVar12 * lVar20 +
                        (res._8_8_ & 0xffffffff) * lVar12 * lVar21 +
                        (ulong)(res._width * iVar18 + iVar17)] = uVar16;
            }
          }
        }
      }
    }
    else if (uVar16 == 0x2103) {
      assign(&res,this->_depth,this->_height,this->_width,this->_spectrum);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar20 = 0;
      for (lVar21 = 0; lVar21 < (int)this->_spectrum; lVar21 = lVar21 + 1) {
        for (iVar17 = 0; iVar17 < (int)this->_depth; iVar17 = iVar17 + 1) {
          for (iVar18 = 0; iVar18 < (int)this->_height; iVar18 = iVar18 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar18 + iVar17) * 4) = uVar16;
              lVar22 = lVar22 + lVar12 * 4;
            }
          }
        }
        lVar20 = lVar20 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
      }
    }
    else if (uVar16 == 0x2130) {
      assign(&res,this->_depth,this->_height,this->_spectrum,this->_width);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar20 = 0;
      for (lVar21 = 0; lVar21 < (int)this->_spectrum; lVar21 = lVar21 + 1) {
        for (iVar17 = 0; iVar17 < (int)this->_depth; iVar17 = iVar17 + 1) {
          for (iVar18 = 0; iVar18 < (int)this->_height; iVar18 = iVar18 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar18 + iVar17) * 4) = uVar16;
              lVar22 = lVar22 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
            }
          }
        }
        lVar20 = lVar20 + lVar12 * 4;
      }
    }
    else if (uVar16 == 0x2301) {
      assign(&res,this->_depth,this->_spectrum,this->_width,this->_height);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        for (iVar18 = 0; iVar18 < (int)this->_depth; iVar18 = iVar18 + 1) {
          lVar20 = 0;
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar17 + iVar18) * 4) = uVar16;
              lVar22 = lVar22 + lVar12 * 4;
            }
            lVar20 = lVar20 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
          }
        }
      }
    }
    else if (uVar16 == 0x2310) {
      assign(&res,this->_depth,this->_spectrum,this->_height,this->_width);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        for (iVar18 = 0; iVar18 < (int)this->_depth; iVar18 = iVar18 + 1) {
          lVar20 = 0;
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar17 + iVar18) * 4) = uVar16;
              lVar22 = lVar22 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
            }
            lVar20 = lVar20 + lVar12 * 4;
          }
        }
      }
    }
    else if (uVar16 == 0x3012) {
      assign(&res,this->_spectrum,this->_width,this->_height,this->_depth);
      uVar16 = this->_spectrum;
      switch(uVar16) {
      case 1:
        puVar13 = this->_data;
        uVar16 = this->_width;
        uVar15 = this->_height;
        uVar2 = this->_depth;
        for (lVar12 = 0; (ulong)uVar2 * (ulong)uVar15 * (ulong)uVar16 - lVar12 != 0;
            lVar12 = lVar12 + 1) {
          res._data[lVar12] = puVar13[lVar12];
        }
        break;
      case 2:
        puVar13 = this->_data;
        lVar12 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
        for (lVar20 = 0; lVar12 - lVar20 != 0; lVar20 = lVar20 + 1) {
          res._data[lVar20 * 2] = puVar13[lVar20];
          res._data[lVar20 * 2 + 1] = puVar13[lVar12 + lVar20];
        }
        break;
      case 3:
        puVar13 = this->_data;
        lVar20 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
        puVar14 = res._data;
        lVar12 = lVar20;
        while (bVar10 = lVar12 != 0, lVar12 = lVar12 + -1, bVar10) {
          *puVar14 = *puVar13;
          puVar14[1] = puVar13[lVar20];
          puVar1 = puVar13 + lVar20 * 2;
          puVar13 = puVar13 + 1;
          puVar14[2] = *puVar1;
          puVar14 = puVar14 + 3;
        }
        break;
      case 4:
        puVar13 = this->_data;
        lVar20 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
        puVar14 = res._data;
        lVar12 = lVar20;
        while (bVar10 = lVar12 != 0, lVar12 = lVar12 + -1, bVar10) {
          *puVar14 = *puVar13;
          puVar14[1] = puVar13[lVar20];
          puVar14[2] = puVar13[lVar20 * 2];
          puVar1 = puVar13 + lVar20 * 3;
          puVar13 = puVar13 + 1;
          puVar14[3] = *puVar1;
          puVar14 = puVar14 + 4;
        }
        break;
      default:
        lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
        for (iVar17 = 0; iVar17 < (int)uVar16; iVar17 = iVar17 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_depth; lVar20 = lVar20 + 1) {
            for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
              for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
                uVar16 = *puVar13;
                puVar13 = puVar13 + 1;
                res._data[lVar12 * lVar21 +
                          (res._8_8_ & 0xffffffff) * lVar12 * lVar20 +
                          (ulong)(res._width * iVar18 + iVar17)] = uVar16;
              }
            }
          }
          uVar16 = this->_spectrum;
        }
      }
    }
    else if (uVar16 == 0x3021) {
      assign(&res,this->_spectrum,this->_width,this->_depth,this->_height);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        for (lVar20 = 0; lVar20 < (int)this->_depth; lVar20 = lVar20 + 1) {
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            for (iVar18 = 0; iVar18 < (int)this->_width; iVar18 = iVar18 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              res._data[lVar12 * lVar20 +
                        (res._8_8_ & 0xffffffff) * lVar12 * lVar21 +
                        (ulong)(res._width * iVar18 + iVar17)] = uVar16;
            }
          }
        }
      }
    }
    else if (uVar16 == 0x3102) {
      assign(&res,this->_spectrum,this->_height,this->_width,this->_depth);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        lVar20 = 0;
        for (lVar21 = 0; lVar21 < (int)this->_depth; lVar21 = lVar21 + 1) {
          for (iVar18 = 0; iVar18 < (int)this->_height; iVar18 = iVar18 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar18 + iVar17) * 4) = uVar16;
              lVar22 = lVar22 + lVar12 * 4;
            }
          }
          lVar20 = lVar20 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
        }
      }
    }
    else if (uVar16 == 0x3120) {
      assign(&res,this->_spectrum,this->_height,this->_depth,this->_width);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        lVar20 = 0;
        for (lVar21 = 0; lVar21 < (int)this->_depth; lVar21 = lVar21 + 1) {
          for (iVar18 = 0; iVar18 < (int)this->_height; iVar18 = iVar18 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar18 + iVar17) * 4) = uVar16;
              lVar22 = lVar22 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
            }
          }
          lVar20 = lVar20 + lVar12 * 4;
        }
      }
    }
    else if (uVar16 == 0x3201) {
      assign(&res,this->_spectrum,this->_depth,this->_width,this->_height);
      lVar12 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar17 = 0; iVar17 < (int)this->_spectrum; iVar17 = iVar17 + 1) {
        for (iVar18 = 0; iVar18 < (int)this->_depth; iVar18 = iVar18 + 1) {
          lVar20 = 0;
          for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
            lVar22 = (long)res._data + lVar20;
            for (lVar23 = 0; lVar23 < (int)this->_width; lVar23 = lVar23 + 1) {
              uVar16 = *puVar13;
              puVar13 = puVar13 + 1;
              *(uint *)(lVar22 + (ulong)(res._width * iVar18 + iVar17) * 4) = uVar16;
              lVar22 = lVar22 + lVar12 * 4;
            }
            lVar20 = lVar20 + (res._8_8_ & 0xffffffff) * lVar12 * 4;
          }
        }
      }
    }
    else if (uVar16 == 0x123) {
      operator+(__return_storage_ptr__,this);
      goto LAB_0019e8b3;
    }
  }
  if (res._data == (uint *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar24 = "non-";
    if (this->_is_shared != false) {
      pcVar24 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes(): Invalid specified axes order \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar24,"unsigned int",axes_order);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  CImg(__return_storage_ptr__,&res);
LAB_0019e8b3:
  ~CImg(&res);
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _permute_axes(const char *const axes_order, const t&) const {
      if (is_empty() || !axes_order) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      unsigned char s_code[4] = { 0,1,2,3 }, n_code[4] = { 0 };
      for (unsigned int l = 0; axes_order[l]; ++l) {
        int c = cimg::lowercase(axes_order[l]);
        if (l>=4 || (c!='x' && c!='y' && c!='z' && c!='c')) { *s_code = 4; break; }
        else { ++n_code[c%=4]; s_code[l] = c; }
      }
      if (*axes_order && *s_code<4 && *n_code<=1 && n_code[1]<=1 && n_code[2]<=1 && n_code[3]<=1) {
        const unsigned int code = (s_code[0]<<12) | (s_code[1]<<8) | (s_code[2]<<4) | (s_code[3]);
        ulongT wh, whd;
        switch (code) {
        case 0x0123 : // xyzc
          return +*this;
        case 0x0132 : // xycz
          res.assign(_width,_height,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0213 : // xzyc
          res.assign(_width,_depth,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0231 : // xzcy
          res.assign(_width,_depth,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0312 : // xcyz
          res.assign(_width,_spectrum,_height,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0321 : // xczy
          res.assign(_width,_spectrum,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1023 : // yxzc
          res.assign(_height,_width,_depth,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1032 : // yxcz
          res.assign(_height,_width,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1203 : // yzxc
          res.assign(_height,_depth,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1230 : // yzcx
          res.assign(_height,_depth,_spectrum,_width);
          switch (_width) {
          case 1 : {
            t *ptr_r = res.data(0,0,0,0);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)*(ptrs++);
            }
          } break;
          case 2 : {
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              ptrs+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              ptrs+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
            t
              *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1),
              *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              *(ptr_a++) = (t)ptrs[3];
              ptrs+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
            return res;
          }
          }
          break;
        case 0x1302 : // ycxz
          res.assign(_height,_spectrum,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1320 : // yczx
          res.assign(_height,_spectrum,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2013 : // zxyc
          res.assign(_depth,_width,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2031 : // zxcy
          res.assign(_depth,_width,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2103 : // zyxc
          res.assign(_depth,_height,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2130 : // zycx
          res.assign(_depth,_height,_spectrum,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2301 : // zcxy
          res.assign(_depth,_spectrum,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2310 : // zcyx
          res.assign(_depth,_spectrum,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3012 : // cxyz
          res.assign(_spectrum,_width,_height,_depth);
          switch (_spectrum) {
          case 1 : {
            const T *ptr_r = data(0,0,0,0);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) *(ptrd++) = (t)*(ptr_r++);
          } break;
          case 2 : {
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd[3] = (t)*(ptr_a++);
              ptrd+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
          }
          }
          break;
        case 0x3021 : // cxzy
          res.assign(_spectrum,_width,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3102 : // cyxz
          res.assign(_spectrum,_height,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3120 : // cyzx
          res.assign(_spectrum,_height,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3201 : // czxy
          res.assign(_spectrum,_depth,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3210 : // czyx
          res.assign(_spectrum,_depth,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
          break;
        }
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes(): Invalid specified axes order '%s'.",
                                    cimg_instance,
                                    axes_order);
      return res;
    }